

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char cVar1;
  byte closure_char;
  uint uVar2;
  pointer pCVar3;
  bool bVar4;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *pvVar5;
  pointer pbVar6;
  bool bVar7;
  __type _Var8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  istream *piVar13;
  size_type sVar14;
  size_type __n;
  undefined8 extraout_RAX;
  ulong uVar15;
  undefined7 extraout_var;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  char cVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  size_t __pos;
  pointer str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  bool bVar17;
  ulong local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  undefined1 local_2a8 [8];
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_2a0;
  string l2;
  uint local_278;
  uint local_274;
  int local_270;
  int local_26c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string name;
  string currentSection;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  string buffer;
  string line_sep_chars;
  string previousSection;
  string local_150 [4];
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  local_2a0 = __return_storage_ptr__;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentSection,"default",(allocator<char> *)&previousSection);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&previousSection,"default",(allocator<char> *)&line_sep_chars);
  (local_2a0->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2a0->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2a0->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = this->arrayStart;
  local_274 = (uint)cVar1;
  cVar16 = this->arrayEnd;
  local_270 = (int)cVar16;
  if (cVar16 == ']' && cVar1 == '[') {
    bVar17 = this->arraySeparator == ',';
  }
  else if ((local_274 & 0xdf) == 0) {
    if (cVar1 == cVar16) {
      bVar17 = false;
      local_270 = 0x5d;
      bVar4 = true;
      local_274 = 0x5b;
      goto LAB_0016acf4;
    }
    bVar17 = false;
  }
  else {
    bVar17 = false;
  }
  bVar4 = false;
LAB_0016acf4:
  cVar1 = this->arraySeparator;
  cVar16 = ',';
  if (cVar1 != ' ') {
    cVar16 = cVar1;
  }
  if (!bVar4) {
    cVar16 = cVar1;
  }
  line_sep_chars.field_2._M_local_buf[0] = this->parentSeparatorChar;
  line_sep_chars.field_2._M_local_buf[1] = this->commentChar;
  line_sep_chars.field_2._M_local_buf[2] = this->valueDelimiter;
  line_sep_chars._M_dataplus._M_p = (pointer)&line_sep_chars.field_2;
  line_sep_chars._M_string_length = 3;
  line_sep_chars.field_2._M_local_buf[3] = '\0';
  iVar12 = 0;
  bVar7 = false;
  do {
    piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)input,(string *)&buffer);
    if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) {
      bVar17 = ::std::operator==(&currentSection,"default");
      if (!bVar17) {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_2a0);
        detail::generate_parents(&parents,&currentSection,&name,this->parentSeparatorChar);
        pvVar5 = local_2a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&(local_2a0->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parents);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&(pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish[-1].name,"--");
        pvVar5 = local_2a0;
        while (pCVar3 = (pvVar5->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish,
              0x20 < (ulong)((long)pCVar3[-1].parents.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pCVar3[-1].parents.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (pvVar5,pCVar3 + -1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&(pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1].parents);
        }
        ::std::__cxx11::string::~string((string *)&name);
      }
      ::std::__cxx11::string::~string((string *)&line_sep_chars);
      ::std::__cxx11::string::~string((string *)&previousSection);
      ::std::__cxx11::string::~string((string *)&currentSection);
      ::std::__cxx11::string::~string((string *)&buffer);
      ::std::__cxx11::string::~string((string *)&line);
      return local_2a0;
    }
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    detail::trim_copy((string *)&parents,&buffer);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&line,(string *)&parents);
    ::std::__cxx11::string::~string((string *)&parents);
    sVar14 = line._M_string_length;
    if (2 < line._M_string_length) {
      iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&line,0,3,"\"\"\"");
      if ((iVar11 == 0) ||
         (iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&line,0,3,"\'\'\'"), iVar11 == 0)) {
        cVar1 = *line._M_dataplus._M_p;
        do {
          piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)input,(string *)&line);
          if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
          detail::trim(&line);
          bVar10 = detail::hasMLString(&line,cVar1);
        } while (!bVar10);
      }
      else {
        cVar1 = *line._M_dataplus._M_p;
        if ((cVar1 != '#') && (cVar1 != ';')) {
          if ((cVar1 == '[') && (line._M_dataplus._M_p[line._M_string_length - 1] == ']')) {
            bVar7 = ::std::operator==(&currentSection,"default");
            if (!bVar7) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        (local_2a0);
              detail::generate_parents(&parents,&currentSection,&name,this->parentSeparatorChar);
              pvVar5 = local_2a0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&(local_2a0->
                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                )._M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&parents);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(&(pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1].name,"--");
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parents
                       ,&line,1,sVar14 - 2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&currentSection,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parents)
            ;
            ::std::__cxx11::string::~string((string *)&parents);
            if (((1 < currentSection._M_string_length) && (*currentSection._M_dataplus._M_p == '['))
               && (currentSection._M_dataplus._M_p[currentSection._M_string_length - 1] == ']')) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parents,
                     &currentSection,1,currentSection._M_string_length - 2);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&currentSection,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &parents);
              ::std::__cxx11::string::~string((string *)&parents);
            }
            ::std::__cxx11::string::string((string *)local_150,&currentSection);
            detail::to_lower((string *)&parents,local_150);
            bVar7 = ::std::operator==((string *)&parents,"default");
            ::std::__cxx11::string::~string((string *)&parents);
            ::std::__cxx11::string::~string((string *)local_150);
            if (bVar7) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(&currentSection,"default");
            }
            else {
              detail::checkParentSegments(local_2a0,&currentSection,this->parentSeparatorChar);
            }
            _Var8 = ::std::operator==(&currentSection,&previousSection);
            if (_Var8) {
              iVar12 = iVar12 + 1;
              bVar7 = false;
            }
            else {
              iVar12 = 0;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&previousSection,&currentSection);
              bVar7 = false;
            }
          }
          else if (cVar1 != this->commentChar) {
            sVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find_first_of(&line,"\"\'`",0);
            __pos = 0;
            if (sVar14 != 0xffffffffffffffff) {
              __pos = 0;
              while (__pos < line._M_string_length) {
                closure_char = line._M_dataplus._M_p[__pos];
                if ((closure_char - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(closure_char - 0x22) & 0x3f) & 1) != 0)) {
                  __pos = detail::close_sequence(&line,__pos,closure_char);
LAB_0016b0ac:
                  __pos = __pos + 1;
                }
                else {
                  if ((closure_char == this->valueDelimiter) || (closure_char == this->commentChar))
                  {
                    __pos = __pos - 1;
                    break;
                  }
                  if (((closure_char == 9) || (closure_char == 0x20)) ||
                     (closure_char == this->parentSeparatorChar)) goto LAB_0016b0ac;
                  __pos = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          find_first_of(&line,&line_sep_chars,__pos);
                }
              }
            }
            sVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find(&line,this->valueDelimiter,__pos + 1);
            __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(&line,this->commentChar,__pos);
            if (sVar14 == 0xffffffffffffffff || __n < sVar14) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&l2,&line,0,__n);
              detail::trim_copy((string *)&parents,&l2);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&name,(string *)&parents);
              ::std::__cxx11::string::~string((string *)&parents);
              ::std::__cxx11::string::~string((string *)&l2);
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parents,"true",(allocator<char> *)&l2);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &items_buffer,(string *)&parents,local_2a8);
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&l2,&line,0,sVar14);
              detail::trim_copy((string *)&parents,&l2);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&name,(string *)&parents);
              ::std::__cxx11::string::~string((string *)&parents);
              ::std::__cxx11::string::~string((string *)&l2);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&l2,&line,sVar14 + 1,0xffffffffffffffff);
              detail::trim_copy((string *)&parents,&l2);
              ::std::__cxx11::string::~string((string *)&l2);
              iVar11 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((string *)&parents,0,3,"\'\'\'");
              if (iVar11 == 0) {
LAB_0016b2d9:
                cVar1 = *(char *)&((parents.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&l2,&buffer,sVar14 + 1,0xffffffffffffffff);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &parents,&l2);
                ::std::__cxx11::string::~string((string *)&l2);
                detail::ltrim((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &parents);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parents,
                      0,3);
                local_26c = (int)cVar1;
                if ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
                   ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                    [(long)parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish] != '\\')) {
                  bVar10 = detail::hasMLString((string *)&parents,cVar1);
                  uVar15 = CONCAT71(extraout_var,bVar10);
                  if (bVar10) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    local_2d8 = 0;
                    bVar10 = false;
                    uVar15 = extraout_RAX_00;
                    if (cVar1 == '\"') {
                      detail::remove_escaped_characters
                                (&l2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&parents);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&parents,&l2);
                      ::std::__cxx11::string::~string((string *)&l2);
                      local_2d8 = 0;
                      bVar10 = false;
                      uVar15 = extraout_RAX_01;
                    }
                  }
                  else {
                    bVar10 = true;
                    local_2d8 = 0;
                  }
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &parents);
                  uVar15 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  local_2d8 = uVar15 & 0xffffffff;
                  bVar10 = true;
                }
                local_278 = (uint)CONCAT71((int7)(uVar15 >> 8),1);
                do {
                  if (!bVar10) break;
                  l2._M_dataplus._M_p = (pointer)&l2.field_2;
                  l2._M_string_length = 0;
                  l2.field_2._M_local_buf[0] = '\0';
                  piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)input,(string *)&l2);
                  uVar2 = *(uint *)(piVar13 + *(long *)(*(long *)piVar13 + -0x18) + 0x20);
                  bVar10 = true;
                  if ((uVar2 & 5) == 0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_assign(&line,&l2);
                    detail::rtrim(&line);
                    bVar9 = detail::hasMLString(&line,(char)local_26c);
                    if (bVar9) {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                (&line);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                (&line);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                (&line);
                      if ((local_2d8 & 1) == 0) {
                        if (((local_278 & 1) == 0) ||
                           (parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&parents,'\n');
                        }
                      }
                      else {
                        detail::ltrim(&line);
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&parents,&line);
                      if ((parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) &&
                         ((parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                          [(long)parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish] == '\n')) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&parents);
                      }
                      if (cVar1 == '\"') {
                        detail::remove_escaped_characters
                                  ((string *)&citems,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&parents);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&parents,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&citems);
                        ::std::__cxx11::string::~string((string *)&citems);
                      }
                      local_278 = 0;
                      bVar10 = false;
                    }
                    else {
                      if ((local_2d8 & 1) == 0) {
                        if (((local_278 & 1) == 0) ||
                           (parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&parents,'\n');
                        }
                      }
                      else {
                        detail::trim(&l2);
                      }
                      if ((l2._M_string_length == 0) ||
                         (l2._M_dataplus._M_p[l2._M_string_length - 1] != '\\')) {
                        local_2d8 = 0;
                      }
                      else {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  (&l2);
                        local_2d8 = 1;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&parents,&l2);
                      local_278 = 0;
                    }
                  }
                  ::std::__cxx11::string::~string((string *)&l2);
                } while ((uVar2 & 5) == 0);
                ::std::__cxx11::string::string
                          ((string *)&l2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &parents);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &items_buffer,&l2,&local_278);
LAB_0016b7db:
                str_00 = &l2;
              }
              else {
                iVar11 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&parents,0,3,"\"\"\"");
                if (__n == 0xffffffffffffffff || iVar11 == 0) {
                  if (iVar11 == 0) goto LAB_0016b2d9;
                }
                else {
                  ::std::__cxx11::string::string
                            ((string *)&local_50,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parents);
                  detail::split_up(&citems,&local_50,this->commentChar);
                  ::std::__cxx11::string::~string((string *)&local_50);
                  detail::trim_copy(&l2,citems.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &parents,&l2);
                  ::std::__cxx11::string::~string((string *)&l2);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&citems);
                }
                if ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x2) ||
                   (local_274 !=
                    (int)*(char *)&((parents.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p))
                {
                  if (!bVar17 && !bVar4) {
LAB_0016b7b4:
                    ::std::__cxx11::string::string
                              ((string *)&l2,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_assign_aux<std::__cxx11::string_const*>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &items_buffer,&l2,&local_278);
                    goto LAB_0016b7db;
                  }
                  sVar14 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&parents,cVar16,0);
                  if (sVar14 == 0xffffffffffffffff) {
                    sVar14 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&parents,' ',0);
                    if (sVar14 == 0xffffffffffffffff) goto LAB_0016b7b4;
                    str_00 = &local_d0;
                    ::std::__cxx11::string::string
                              ((string *)str_00,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,'\0');
                  }
                  else {
                    str_00 = &local_b0;
                    ::std::__cxx11::string::string
                              ((string *)str_00,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar16);
                  }
                }
                else {
                  l2._M_dataplus._M_p = (pointer)&l2.field_2;
                  l2._M_string_length = 0;
                  l2.field_2._M_local_buf[0] = '\0';
                  while ((local_270 !=
                          (parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                          [(long)parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish] &&
                         (piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                              ((istream *)input,(string *)&l2),
                         ((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) == 0))) {
                    detail::trim(&l2);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parents,&l2);
                  }
                  ::std::__cxx11::string::~string((string *)&l2);
                  if (local_270 ==
                      (parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                      [(long)parents.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish]) {
                    str_00 = &local_70;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(str_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&parents,1,
                             (size_type)
                             ((long)&parents.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1].field_2 + 0xe));
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar16);
                  }
                  else {
                    str_00 = &local_90;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(str_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&parents,1,0xffffffffffffffff);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar16);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&items_buffer,&l2);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&l2);
              }
              ::std::__cxx11::string::~string((string *)str_00);
            }
            ::std::__cxx11::string::~string((string *)&parents);
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&l2,&currentSection,&name,this->parentSeparatorChar);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&parents,&l2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&l2);
            detail::process_quoted_string(&name,'\"','\'');
            pbVar6 = items_buffer.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (str = items_buffer.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; str != pbVar6; str = str + 1) {
              detail::process_quoted_string(str,this->stringQuote,this->literalQuote);
            }
            if ((ulong)((long)parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <=
                (ulong)this->maximumLayers) {
              if ((this->configSection)._M_string_length != 0 && !bVar7) {
                if (((parents.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      parents.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) ||
                    (_Var8 = ::std::operator==(parents.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               &this->configSection), !_Var8)) ||
                   (iVar12 != this->configIndex && -1 < this->configIndex)) {
                  bVar7 = false;
                  goto LAB_0016ba07;
                }
                bVar7 = true;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&parents,(const_iterator)
                                 parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              }
              pCVar3 = (local_2a0->
                       super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              if ((((local_2a0->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_start == pCVar3) ||
                  (_Var8 = ::std::operator==(&name,&pCVar3[-1].name), !_Var8)) ||
                 (bVar10 = ::std::operator==(&parents,&(local_2a0->
                                                                                                              
                                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  parents), !bVar10)) {
                pvVar5 = local_2a0;
                std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                          (local_2a0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&(pvVar5->
                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&(pvVar5->
                           super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                           _M_impl.super__Vector_impl_data._M_finish[-1].name,&name);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&(pvVar5->
                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1].inputs,
                                 &items_buffer);
              }
              else {
                pCVar3 = (local_2a0->
                         super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pCVar3[-1].inputs,
                           pCVar3[-1].inputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )items_buffer.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )items_buffer.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
LAB_0016ba07:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parents);
          }
        }
      }
    }
    ::std::__cxx11::string::~string((string *)&name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items_buffer);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // mutliline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}